

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_chol_t * matd_chol(matd_t *A)

{
  matd_t mVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  matd_t *pmVar5;
  matd_chol_t *pmVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  matd_t __x;
  double dVar17;
  
  uVar2 = A->nrows;
  uVar15 = (ulong)uVar2;
  if (uVar2 == A->ncols) {
    pmVar5 = matd_copy(A);
    iVar13 = 1;
    if (0 < (int)uVar2) {
      uVar16 = 1;
      uVar9 = 0;
      uVar14 = uVar15;
      do {
        iVar7 = (int)uVar9;
        mVar1 = pmVar5[(ulong)((pmVar5->ncols + 1) * iVar7) + 1];
        __x.nrows = 0xe2308c3a;
        __x.ncols = 0x3e45798e;
        if (1e-08 <= (double)mVar1) {
          __x = mVar1;
        }
        if ((double)__x < 0.0) {
          dVar17 = sqrt((double)__x);
        }
        else {
          dVar17 = SQRT((double)__x);
        }
        uVar3 = (pmVar5->ncols + 1) * iVar7;
        uVar8 = uVar14;
        do {
          pmVar5[(ulong)uVar3 + 1] = (matd_t)((double)pmVar5[(ulong)uVar3 + 1] * (1.0 / dVar17));
          uVar3 = uVar3 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        if ((double)mVar1 <= 0.0) {
          iVar13 = 0;
        }
        uVar9 = uVar9 + 1;
        if ((int)uVar9 < (int)uVar2) {
          iVar7 = pmVar5->ncols * iVar7;
          iVar4 = pmVar5->ncols + 1;
          uVar3 = (int)uVar16 * iVar4;
          uVar8 = uVar16;
          do {
            mVar1 = pmVar5[(ulong)(uint)(iVar7 + (int)uVar8) + 1];
            if (((double)mVar1 != 0.0) || (NAN((double)mVar1))) {
              uVar11 = uVar8 & 0xffffffff;
              uVar12 = uVar3;
              do {
                pmVar5[(ulong)uVar12 + 1] =
                     (matd_t)((double)pmVar5[(ulong)uVar12 + 1] -
                             (double)pmVar5[(ulong)(uint)(iVar7 + (int)uVar11) + 1] * (double)mVar1)
                ;
                uVar12 = uVar12 + 1;
                uVar10 = (int)uVar11 + 1;
                uVar11 = (ulong)uVar10;
              } while ((int)uVar10 < (int)uVar2);
            }
            uVar8 = uVar8 + 1;
            uVar3 = uVar3 + iVar4;
          } while (uVar8 != uVar15);
        }
        uVar16 = uVar16 + 1;
        uVar14 = uVar14 - 1;
      } while (uVar9 != uVar15);
    }
    pmVar6 = (matd_chol_t *)calloc(1,0x10);
    pmVar6->is_spd = iVar13;
    pmVar6->u = pmVar5;
    return pmVar6;
  }
  __assert_fail("A->nrows == A->ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x72d,"matd_chol_t *matd_chol(matd_t *)");
}

Assistant:

matd_chol_t *matd_chol(matd_t *A)
{
    assert(A->nrows == A->ncols);
    int N = A->nrows;

    // make upper right
    matd_t *U = matd_copy(A);

    // don't actually need to clear lower-left... we won't touch it.
/*    for (int i = 0; i < U->nrows; i++) {
      for (int j = 0; j < i; j++) {
//            assert(MATD_EL(U, i, j) == MATD_EL(U, j, i));
MATD_EL(U, i, j) = 0;
}
}
*/
    int is_spd = 1; // (A->nrows == A->ncols);

    for (int i = 0; i < N; i++) {
        double d = MATD_EL(U, i, i);
        is_spd &= (d > 0);

        if (d < MATD_EPS)
            d = MATD_EPS;
        d = 1.0 / sqrt(d);

        for (int j = i; j < N; j++)
            MATD_EL(U, i, j) *= d;

        for (int j = i+1; j < N; j++) {
            double s = MATD_EL(U, i, j);

            if (s == 0)
                continue;

            for (int k = j; k < N; k++) {
                MATD_EL(U, j, k) -= MATD_EL(U, i, k)*s;
            }
        }
    }

    matd_chol_t *chol = calloc(1, sizeof(matd_chol_t));
    chol->is_spd = is_spd;
    chol->u = U;
    return chol;
}